

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_new_output_leaf(lyd_node *parent,lys_module *module,char *name,char *val_str)

{
  ly_ctx *ctx;
  int iVar1;
  lys_node *node;
  lys_node *parent_00;
  size_t sVar2;
  lyd_node *plVar3;
  lys_module *plVar4;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (((parent != (lyd_node *)0x0 || module != (lys_module *)0x0) && name != (char *)0x0) &&
     (node = lyd_new_find_schema(parent,module,1), node != (lys_node *)0x0)) {
    parent_00 = lys_parent(node);
    sVar2 = strlen(name);
    iVar1 = lys_getnext_data(module,parent_00,name,(int)sVar2,LYS_LEAFLIST|LYS_LEAF,0,&local_38);
    if (iVar1 == 0 && local_38 != (lys_node *)0x0) {
      plVar3 = _lyd_new_leaf(parent,local_38,val_str,0,0);
      return plVar3;
    }
    ctx = node->module->ctx;
    plVar4 = lys_node_module(node);
    ly_log(ctx,LY_LLERR,LY_EINVAL,"Failed to find \"%s\" as a sibling to \"%s:%s\".",name,
           plVar4->name,node->name);
    return (lyd_node *)0x0;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_output_leaf");
  return (lyd_node *)0x0;
}

Assistant:

lyd_node *
lyd_new_output_leaf(struct lyd_node *parent, const struct lys_module *module, const char *name, const char *val_str)
{
    const struct lys_node *snode = NULL, *siblings;

    if ((!parent && !module) || !name) {
        LOGARG;
        return NULL;
    }

    siblings = lyd_new_find_schema(parent, module, 1);
    if (!siblings) {
        LOGARG;
        return NULL;
    }

    if (lys_getnext_data(module, lys_parent(siblings), name, strlen(name), LYS_LEAFLIST | LYS_LEAF, 0, &snode) || !snode) {
        LOGERR(siblings->module->ctx, LY_EINVAL, "Failed to find \"%s\" as a sibling to \"%s:%s\".",
               name, lys_node_module(siblings)->name, siblings->name);
        return NULL;
    }

    return _lyd_new_leaf(parent, snode, val_str, 0, 0);
}